

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode cf_socket_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  void *pvVar1;
  connectdata *pcVar2;
  long lVar3;
  undefined4 *puVar4;
  ip_quadruple *piVar5;
  byte bVar6;
  
  bVar6 = 0;
  if (event != 4) {
    if (event == 0x101) {
      *(undefined4 *)((long)cf->ctx + 0x98) = 0xffffffff;
      return CURLE_OK;
    }
    if (event != 0x100) {
      return CURLE_OK;
    }
    pvVar1 = cf->ctx;
    cf->conn->sock[cf->sockindex] = *(curl_socket_t *)((long)pvVar1 + 0x98);
    set_local_ip(cf,data);
    if (cf->sockindex == 0) {
      puVar4 = (undefined4 *)((long)pvVar1 + 0x9c);
      piVar5 = &cf->conn->primary;
      for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)piVar5->remote_ip = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        piVar5 = (ip_quadruple *)((long)piVar5 + (ulong)bVar6 * -8 + 4);
      }
      pcVar2 = cf->conn;
      pcVar2->remote_addr = (Curl_sockaddr_ex *)((long)pvVar1 + 8);
      pcVar2->bits = (ConnectBits)
                     ((ulong)pcVar2->bits & 0xfffffffffffff7ff |
                     (ulong)(*(int *)((long)pvVar1 + 8) == 10) << 0xb);
    }
    else {
      puVar4 = (undefined4 *)((long)pvVar1 + 0x9c);
      piVar5 = &cf->conn->secondary;
      for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)piVar5->remote_ip = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        piVar5 = (ip_quadruple *)((long)piVar5 + (ulong)bVar6 * -8 + 4);
      }
    }
    *(byte *)((long)pvVar1 + 0x134) = *(byte *)((long)pvVar1 + 0x134) | 0x10;
  }
  cf_socket_update_data(cf,data);
  return CURLE_OK;
}

Assistant:

static CURLcode cf_socket_cntrl(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                int event, int arg1, void *arg2)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  (void)arg1;
  (void)arg2;
  switch(event) {
  case CF_CTRL_CONN_INFO_UPDATE:
    cf_socket_active(cf, data);
    cf_socket_update_data(cf, data);
    break;
  case CF_CTRL_DATA_SETUP:
    cf_socket_update_data(cf, data);
    break;
  case CF_CTRL_FORGET_SOCKET:
    ctx->sock = CURL_SOCKET_BAD;
    break;
  }
  return CURLE_OK;
}